

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Projection::Write(Projection *this,IMkvWriter *writer)

{
  bool bVar1;
  IMkvWriter *writer_00;
  IMkvWriter *in_RSI;
  uint8 *in_RDI;
  uint64_t size;
  float value;
  Projection *in_stack_ffffffffffffffe0;
  bool local_1;
  
  writer_00 = (IMkvWriter *)PayloadSize(in_stack_ffffffffffffffe0);
  if (writer_00 == (IMkvWriter *)0x0) {
    local_1 = true;
  }
  else {
    bVar1 = WriteEbmlMasterElement(in_RSI,(uint64)writer_00,(uint64)in_RDI);
    if (bVar1) {
      bVar1 = WriteEbmlElement(writer_00,(uint64)in_RDI,0x1739eb);
      if (bVar1) {
        if (((*(long *)(in_RDI + 0x18) != 0) && (*(long *)(in_RDI + 0x10) != 0)) &&
           (bVar1 = WriteEbmlElement(in_RSI,(uint64)writer_00,in_RDI,0x173a2a), !bVar1)) {
          return false;
        }
        value = (float)((ulong)in_RDI >> 0x20);
        bVar1 = WriteEbmlElement(in_RSI,(uint64)writer_00,value);
        if (bVar1) {
          bVar1 = WriteEbmlElement(in_RSI,(uint64)writer_00,value);
          if (bVar1) {
            bVar1 = WriteEbmlElement(in_RSI,(uint64)writer_00,value);
            if (bVar1) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Projection::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvProjection, size))
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionType,
                        static_cast<uint64>(type_))) {
    return false;
  }

  if (private_data_length_ > 0 && private_data_ != NULL &&
      !WriteEbmlElement(writer, libwebm::kMkvProjectionPrivate, private_data_,
                        private_data_length_)) {
    return false;
  }

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPoseYaw, pose_yaw_))
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPosePitch,
                        pose_pitch_)) {
    return false;
  }

  if (!WriteEbmlElement(writer, libwebm::kMkvProjectionPoseRoll, pose_roll_)) {
    return false;
  }

  return true;
}